

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O1

int pt_pkt_decoder_init(pt_packet_decoder *decoder,pt_config *config)

{
  uint uVar1;
  
  if (config != (pt_config *)0x0 && decoder != (pt_packet_decoder *)0x0) {
    memset(decoder,0,0x128);
    uVar1 = pt_config_from_user(&decoder->config,config);
    return uVar1 & (int)uVar1 >> 0x1f;
  }
  return -2;
}

Assistant:

int pt_pkt_decoder_init(struct pt_packet_decoder *decoder,
			const struct pt_config *config)
{
	int errcode;

	if (!decoder || !config)
		return -pte_invalid;

	memset(decoder, 0, sizeof(*decoder));

	errcode = pt_config_from_user(&decoder->config, config);
	if (errcode < 0)
		return errcode;

	return 0;
}